

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int xmlNodeDump(xmlBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,int level,int format)

{
  int iVar1;
  xmlBufPtr buf_00;
  size_t local_50;
  int ret2;
  size_t ret1;
  xmlBufPtr buffer;
  int format_local;
  int level_local;
  xmlNodePtr cur_local;
  xmlDocPtr doc_local;
  xmlBufferPtr buf_local;
  
  if ((buf == (xmlBufferPtr)0x0) || (cur == (xmlNodePtr)0x0)) {
    buf_local._4_4_ = -1;
  }
  else {
    if (level < 0) {
      buffer._4_4_ = 0;
    }
    else {
      buffer._4_4_ = level;
      if (100 < level) {
        buffer._4_4_ = 100;
      }
    }
    buf_00 = xmlBufFromBuffer(buf);
    if (buf_00 == (xmlBufPtr)0x0) {
      buf_local._4_4_ = -1;
    }
    else {
      local_50 = xmlBufNodeDump(buf_00,doc,cur,buffer._4_4_,format);
      iVar1 = xmlBufBackToBuffer(buf_00,buf);
      if ((local_50 == 0xffffffffffffffff) || (iVar1 < 0)) {
        buf_local._4_4_ = -1;
      }
      else {
        if (0x7fffffff < local_50) {
          local_50 = 0x7fffffff;
        }
        buf_local._4_4_ = (int)local_50;
      }
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlNodeDump(xmlBufferPtr buf, xmlDocPtr doc, xmlNodePtr cur, int level,
            int format)
{
    xmlBufPtr buffer;
    size_t ret1;
    int ret2;

    if ((buf == NULL) || (cur == NULL))
        return(-1);
    if (level < 0)
        level = 0;
    else if (level > 100)
        level = 100;
    buffer = xmlBufFromBuffer(buf);
    if (buffer == NULL)
        return(-1);
    ret1 = xmlBufNodeDump(buffer, doc, cur, level, format);
    ret2 = xmlBufBackToBuffer(buffer, buf);
    if ((ret1 == (size_t) -1) || (ret2 < 0))
        return(-1);
    return(ret1 > INT_MAX ? INT_MAX : ret1);
}